

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CCDPP.h
# Opt level: O2

void __thiscall
CCDPP::predict(CCDPP *this,vector<Rating,_std::allocator<Rating>_> *ratings,string *log)

{
  thread_pool<boost::function0<void>,_boost::threadpool::fifo_scheduler,_boost::threadpool::static_size,_boost::threadpool::resize_controller,_boost::threadpool::wait_for_all_tasks>
  *this_00;
  ulong uVar1;
  ostream *poVar2;
  int iVar3;
  double dVar4;
  undefined1 auVar5 [16];
  allocator_type local_b5;
  int rating_size;
  double local_b0;
  int workload;
  string *local_a0;
  vector<double,_std::allocator<double>_> rmses;
  _Bind<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Hui_Li[P]CCDPP_alg_CCDPP_h:145:45)_(int)>
  local_80;
  function0<void> local_50;
  
  uVar1 = ((long)(ratings->super__Vector_base<Rating,_std::allocator<Rating>_>)._M_impl.
                 super__Vector_impl_data._M_finish -
          (long)(ratings->super__Vector_base<Rating,_std::allocator<Rating>_>)._M_impl.
                super__Vector_impl_data._M_start) / 0x18;
  rating_size = (int)uVar1;
  iVar3 = this->parameter->num_of_thread;
  uVar1 = (ulong)(uint)(rating_size >> 0x1f) << 0x20 | uVar1 & 0xffffffff;
  workload = ((int)((long)uVar1 / (long)iVar3) + 1) - (uint)((int)((long)uVar1 % (long)iVar3) == 0);
  local_50.super_function_base.vtable = (vtable_base *)0x0;
  local_a0 = log;
  std::vector<double,_std::allocator<double>_>::vector
            (&rmses,(long)iVar3,(value_type_conflict1 *)&local_50,&local_b5);
  for (iVar3 = 0; this_00 = this->thread_pool, iVar3 < this->parameter->num_of_thread;
      iVar3 = iVar3 + 1) {
    local_80._M_f.workload = &workload;
    local_80._M_f.rating_size = &rating_size;
    local_80._M_f.rmses = &rmses;
    local_80._M_f.ratings = ratings;
    local_80._M_f.this = this;
    local_80._M_bound_args.super__Tuple_impl<0UL,_int>.super__Head_base<0UL,_int,_false>.
    _M_head_impl = (_Tuple_impl<0UL,_int>)(_Tuple_impl<0UL,_int>)iVar3;
    boost::function0<void>::
    function0<std::_Bind<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Hui_Li[P]CCDPP_alg_CCDPP_h:145:45)_(int)>_>
              (&local_50,&local_80,0);
    boost::threadpool::
    thread_pool<boost::function0<void>,_boost::threadpool::fifo_scheduler,_boost::threadpool::static_size,_boost::threadpool::resize_controller,_boost::threadpool::wait_for_all_tasks>
    ::schedule(this_00,&local_50);
    boost::function0<void>::~function0(&local_50);
  }
  boost::threadpool::
  thread_pool<boost::function0<void>,_boost::threadpool::fifo_scheduler,_boost::threadpool::static_size,_boost::threadpool::resize_controller,_boost::threadpool::wait_for_all_tasks>
  ::wait(this_00,(void *)0x0);
  local_b0 = 0.0;
  for (; rmses.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
         _M_start !=
         rmses.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
         _M_finish;
      rmses.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start = rmses.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start + 1) {
    local_b0 = local_b0 +
               *rmses.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start;
  }
  std::operator<<((ostream *)&std::cout,(string *)local_a0);
  auVar5._0_8_ = local_b0 / (double)rating_size;
  auVar5._8_8_ = 0;
  if (auVar5._0_8_ < 0.0) {
    dVar4 = sqrt(auVar5._0_8_);
  }
  else {
    auVar5 = vsqrtsd_avx(auVar5,auVar5);
    dVar4 = auVar5._0_8_;
  }
  poVar2 = std::ostream::_M_insert<double>(dVar4);
  std::endl<char,std::char_traits<char>>(poVar2);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&rmses.super__Vector_base<double,_std::allocator<double>_>);
  return;
}

Assistant:

inline void predict(vector<Rating> &ratings, const string log) {

        int rating_size = ratings.size();
        int workload = rating_size / parameter->num_of_thread + ((rating_size % parameter->num_of_thread == 0) ? 0 : 1);

        vector<value_type> rmses(parameter->num_of_thread, 0);

        for (int thread_index = 0; thread_index < parameter->num_of_thread; thread_index++) {
            thread_pool->schedule(std::bind([&](const int thread_index) {
                int start = workload * thread_index;
                int end = std::min(start + workload, rating_size);

                for (int i = start; i < end; i++) {
                    Rating &rating = ratings[i];
                    value_type prediction = 0;
                    for (int d = 0; d < parameter->k; d++) {
                        prediction += Q[d * user_num + rating.user_id] * P[d * item_num + rating.item_id];
                    }

                    value_type error = rating.score - prediction;
                    rmses[thread_index] += error * error;
                }
            }, thread_index));
        }
        thread_pool->wait();

        value_type result = 0;

        for (value_type rmse:rmses) {
            result += rmse;
        }

        cout << log << sqrt(result / rating_size) << endl;
    }